

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTestSuites(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  TestSuite *this;
  char *pcVar3;
  TestSuite *test_suite;
  int i;
  int suite_failure_count;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int local_10;
  uint local_c;
  
  local_c = 0;
  local_10 = 0;
  while (iVar4 = local_10, iVar2 = UnitTest::total_test_suite_count((UnitTest *)0x13770b),
        iVar4 < iVar2) {
    this = UnitTest::GetTestSuite
                     ((UnitTest *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    bVar1 = TestSuite::should_run(this);
    if (bVar1) {
      TestSuite::ad_hoc_test_result(this);
      bVar1 = TestResult::Failed((TestResult *)this);
      if (bVar1) {
        ColoredPrintf(kRed,"[  FAILED  ] ");
        pcVar3 = TestSuite::name((TestSuite *)0x137771);
        printf("%s: SetUpTestSuite or TearDownTestSuite\n",pcVar3);
        local_c = local_c + 1;
      }
    }
    local_10 = local_10 + 1;
  }
  if (0 < (int)local_c) {
    pcVar3 = "SUITES";
    if (local_c == 1) {
      pcVar3 = "SUITE";
    }
    printf("\n%2d FAILED TEST %s\n",(ulong)local_c,pcVar3);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTestSuites(
    const UnitTest& unit_test) {
  int suite_failure_count = 0;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run()) {
      continue;
    }
    if (test_suite.ad_hoc_test_result().Failed()) {
      ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
      printf("%s: SetUpTestSuite or TearDownTestSuite\n", test_suite.name());
      ++suite_failure_count;
    }
  }
  if (suite_failure_count > 0) {
    printf("\n%2d FAILED TEST %s\n", suite_failure_count,
           suite_failure_count == 1 ? "SUITE" : "SUITES");
  }
}